

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O2

size_t Imf_3_4::anon_unknown_2::getVariableLengthIntegerSize(uint64_t value)

{
  undefined8 uStack_8;
  
  if (value < 0x80) {
    uStack_8 = 1;
  }
  else if (value < 0x4000) {
    uStack_8 = 2;
  }
  else if (value < 0x200000) {
    uStack_8 = 3;
  }
  else if (value < 0x10000000) {
    uStack_8 = 4;
  }
  else if (value >> 0x23 == 0) {
    uStack_8 = 5;
  }
  else if (value >> 0x2a == 0) {
    uStack_8 = 6;
  }
  else if (value >> 0x31 == 0) {
    uStack_8 = 7;
  }
  else {
    if (value >> 0x38 != 0) {
      return 9 - ((long)value >> 0x3f);
    }
    uStack_8 = 8;
  }
  return uStack_8;
}

Assistant:

size_t
getVariableLengthIntegerSize (uint64_t value)
{

    if (value < 1llu << 7) { return 1; }

    if (value < 1llu << 14) { return 2; }
    if (value < 1llu << 21) { return 3; }
    if (value < 1llu << 28) { return 4; }
    if (value < 1llu << 35) { return 5; }
    if (value < 1llu << 42) { return 6; }
    if (value < 1llu << 49) { return 7; }
    if (value < 1llu << 56) { return 8; }
    if (value < 1llu << 63) { return 9; }
    return 10;
}